

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address addr;
  ConfidentialTransactionController txc;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff23c;
  Address *in_stack_fffffffffffff240;
  Address *this_00;
  undefined8 in_stack_fffffffffffff248;
  ConfidentialTransactionController *in_stack_fffffffffffff250;
  uint32_t in_stack_fffffffffffff258;
  undefined4 uVar5;
  uint32_t in_stack_fffffffffffff25c;
  Txid *in_stack_fffffffffffff260;
  Amount *value;
  undefined4 in_stack_fffffffffffff268;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff26c;
  ConfidentialAssetId *in_stack_fffffffffffff2e0;
  allocator *paVar7;
  Amount *in_stack_fffffffffffff2e8;
  Address *in_stack_fffffffffffff2f0;
  undefined7 in_stack_fffffffffffff2f8;
  undefined1 in_stack_fffffffffffff2ff;
  AssertHelper local_cd0;
  Message local_cc8;
  string local_cc0;
  AssertionResult local_ca0;
  AssertHelper local_c90;
  Message local_c88;
  string local_c80 [32];
  AssertionResult local_c60;
  allocator local_c49;
  string local_c48;
  ConfidentialAssetId local_c28;
  int64_t local_c00;
  undefined1 local_bf8;
  int64_t local_bf0;
  undefined1 local_be8;
  allocator local_ae1;
  string local_ae0;
  ByteData local_ac0;
  allocator local_aa1;
  string local_aa0 [39];
  allocator local_a79;
  string local_a78;
  Address *in_stack_fffffffffffff5a8;
  BlockHash *in_stack_fffffffffffff5b0;
  ConfidentialAssetId *in_stack_fffffffffffff5b8;
  Amount *in_stack_fffffffffffff5c0;
  ConfidentialTransactionController *in_stack_fffffffffffff5c8;
  string local_a30 [16];
  undefined4 in_stack_fffffffffffff5e0;
  undefined8 in_stack_fffffffffffff5e8;
  Privkey *in_stack_fffffffffffff5f0;
  string *in_stack_fffffffffffff5f8;
  uint32_t in_stack_fffffffffffff600;
  ByteData *in_stack_fffffffffffff608;
  undefined4 in_stack_fffffffffffff610;
  undefined8 in_stack_fffffffffffff618;
  Address local_9d0;
  allocator local_851;
  string local_850;
  BlockHash local_830;
  allocator local_809;
  string local_808;
  ConfidentialAssetId local_7e8;
  int64_t local_7c0;
  undefined1 local_7b8;
  int64_t local_7b0;
  undefined1 local_7a8;
  allocator local_6a1;
  string local_6a0;
  ConfidentialAssetId local_680;
  int64_t local_658;
  undefined1 local_650;
  int64_t local_648;
  undefined1 local_640;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_638;
  allocator local_619;
  string local_618;
  Address local_5f8;
  allocator local_381;
  string local_380;
  Txid local_360 [12];
  Address local_1d0;
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffff250,(uint32_t)((ulong)in_stack_fffffffffffff248 >> 0x20),
             (uint32_t)in_stack_fffffffffffff248);
  cfd::core::Address::Address(&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_380,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_381);
  cfd::core::Txid::Txid(local_360,&local_380);
  cfd::ConfidentialTransactionController::AddTxIn
            ((ConfidentialTransactionController *)
             CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),in_stack_fffffffffffff260
             ,in_stack_fffffffffffff25c,in_stack_fffffffffffff258);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)in_stack_fffffffffffff240);
  cfd::core::Txid::~Txid((Txid *)0x20e0cd);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_618,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",&local_619)
  ;
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&local_5f8,&local_618,&local_638);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_658 = AVar3.amount_;
  local_650 = AVar3.ignore_check_;
  local_648 = local_658;
  local_640 = local_650;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6a0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_6a1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_680,&local_6a0);
  cfd::ConfidentialTransactionController::AddTxOut
            ((ConfidentialTransactionController *)
             CONCAT17(in_stack_fffffffffffff2ff,in_stack_fffffffffffff2f8),in_stack_fffffffffffff2f0
             ,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)in_stack_fffffffffffff240);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x20e237);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  cfd::core::Address::~Address(in_stack_fffffffffffff240);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff250);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_7c0 = AVar3.amount_;
  local_7b8 = AVar3.ignore_check_;
  paVar7 = &local_809;
  local_7b0 = local_7c0;
  local_7a8 = local_7b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_808,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,paVar7);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7e8,&local_808);
  paVar7 = &local_851;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_850,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,paVar7);
  cfd::core::BlockHash::BlockHash(&local_830,&local_850);
  paVar7 = (allocator *)&stack0xfffffffffffff60f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff610,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",paVar7);
  cfd::core::Address::Address(&local_9d0,(string *)&stack0xfffffffffffff610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a30,"0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",
             (allocator *)&stack0xfffffffffffff5cf);
  cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xfffffffffffff5f0,(string *)local_a30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a78,"cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL",&local_a79)
  ;
  cfd::core::Privkey::FromWif((Privkey *)&stack0xfffffffffffff5a8,&local_a78,kRegtest,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_aa0,
             "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
             ,&local_aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ae0,
             "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"
             ,&local_ae1);
  cfd::core::ByteData::ByteData(&local_ac0,&local_ae0);
  value = (Amount *)&local_ac0;
  this_00 = (Address *)&stack0xfffffffffffff5f0;
  uVar6 = 4;
  uVar5 = 0;
  uVar4 = 2;
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
             in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5e0,
             (Pubkey *)in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5f8
             ,in_stack_fffffffffffff600,in_stack_fffffffffffff608,in_stack_fffffffffffff610,
             (Address *)in_stack_fffffffffffff618);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)this_00);
  cfd::core::ByteData::~ByteData((ByteData *)0x20e581);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  std::__cxx11::string::~string(local_aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  cfd::core::Privkey::~Privkey((Privkey *)0x20e5c2);
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x20e5e9);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff5cf);
  cfd::core::Address::~Address(this_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff610);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff60f);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x20e637);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x20e65e);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator((allocator<char> *)&local_809);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_c00 = AVar3.amount_;
  local_bf8 = AVar3.ignore_check_;
  local_bf0 = local_c00;
  local_be8 = local_bf8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c48,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_c49);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_c28,&local_c48);
  cfd::ConfidentialTransactionController::AddTxOutFee
            ((ConfidentialTransactionController *)CONCAT44(in_stack_fffffffffffff26c,uVar6),value,
             (ConfidentialAssetId *)CONCAT44(in_stack_fffffffffffff25c,uVar5));
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)this_00);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x20e748);
  std::__cxx11::string::~string((string *)&local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((AbstractTransactionController *)CONCAT44(in_stack_fffffffffffff23c,uVar4));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c60,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,pcVar2,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string(local_c80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c60);
  if (!bVar1) {
    testing::Message::Message(&local_c88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x20ec9e);
    testing::internal::AssertHelper::AssertHelper
              (&local_c90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c90,&local_c88);
    testing::internal::AssertHelper::~AssertHelper(&local_c90);
    testing::Message::~Message((Message *)0x20ecfb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x20ed53);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_cc0,&local_1d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_ca0,"addr.GetAddress().c_str()",
             "\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",pcVar2,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo")
  ;
  std::__cxx11::string::~string((string *)&local_cc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ca0);
  if (!bVar1) {
    testing::Message::Message(&local_cc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x20ee3a);
    testing::internal::AssertHelper::AssertHelper
              (&local_cd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cd0,&local_cc8);
    testing::internal::AssertHelper::~AssertHelper(&local_cd0);
    testing::Message::~Message((Message *)0x20ee97);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x20eeec);
  cfd::core::Address::~Address(this_00);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_00);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut)
{
    ConfidentialTransactionController txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
}